

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::
ImmutableMessageOneofFieldLiteGenerator
          (ImmutableMessageOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofDescriptor *oneof;
  OneofGeneratorInfo *info_00;
  OneofGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutableMessageOneofFieldLiteGenerator *this_local;
  
  ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator
            (&this->super_ImmutableMessageFieldLiteGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  (this->super_ImmutableMessageFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  _vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMessageOneofFieldLiteGenerator_006f6760;
  oneof = FieldDescriptor::containing_oneof(descriptor);
  info_00 = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info_00,&(this->super_ImmutableMessageFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutableMessageOneofFieldLiteGenerator::
ImmutableMessageOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                 int messageBitIndex,
                                 int builderBitIndex,
                                 Context* context)
    : ImmutableMessageFieldLiteGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}